

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O1

void __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>::Assemble
          (TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_> *this,
          TPZBaseMatrix *stiff_base,TPZBaseMatrix *rhs_base,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  TPZCompMesh *mesh;
  TPZCompEl *el;
  _Base_ptr p_Var1;
  int iVar2;
  long lVar3;
  int64_t size;
  TPZCompEl **ppTVar4;
  long *plVar5;
  ostream *poVar6;
  _Rb_tree_header *p_Var7;
  _Rb_tree_header *p_Var8;
  long lVar9;
  long nelem;
  long lVar10;
  TPZVec<int> elorder;
  TPZElementMatrixT<double> ef;
  TPZElementMatrixT<double> ek;
  int local_86f4;
  _Rb_tree_header *local_86f0;
  TPZCompMesh *local_86e8;
  TPZFMatrix<double> *local_86e0;
  TPZMatrix<double> *local_86d8;
  TPZVec<int> local_86d0;
  TPZElementMatrixT<double> local_86b0;
  TPZElementMatrixT<double> local_4370;
  
  lVar3 = __dynamic_cast(stiff_base,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo,0);
  if ((lVar3 == 0) ||
     (lVar3 = __dynamic_cast(rhs_base,&TPZBaseMatrix::typeinfo,&TPZFMatrix<double>::typeinfo,0),
     lVar3 != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "virtual void TPZFrontStructMatrix<TPZFrontNonSym<double>>::Assemble(TPZBaseMatrix &, TPZBaseMatrix &, TPZAutoPointer<TPZGuiInterface>) [TFront = TPZFrontNonSym<double>, TVar = double, TPar = TPZStructMatrixOR<STATE>]"
               ,0xd8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," incompatible types. Aborting...\n",0x21);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZFrontStructMatrix.cpp"
               ,0x145);
  }
  local_86d8 = (TPZMatrix<double> *)
               __dynamic_cast(stiff_base,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo,0);
  if ((local_86d8 == (TPZMatrix<double> *)0x0) ||
     (local_86e0 = (TPZFMatrix<double> *)
                   __dynamic_cast(rhs_base,&TPZBaseMatrix::typeinfo,&TPZFMatrix<double>::typeinfo,0)
     , local_86e0 == (TPZFMatrix<double> *)0x0)) {
    __cxa_bad_cast();
  }
  mesh = (this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh;
  lVar3 = (mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  TPZElementMatrixT<double>::TPZElementMatrixT(&local_4370,mesh,EK);
  TPZElementMatrixT<double>::TPZElementMatrixT
            (&local_86b0,(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh,EF);
  local_86e8 = (this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh;
  size = TPZCompMesh::NEquations(local_86e8);
  local_86f4 = 0;
  TPZVec<int>::TPZVec(&local_86d0,size,&local_86f4);
  OrderElement(this);
  if (0 < lVar3) {
    local_86e8 = (TPZCompMesh *)&local_86e8->fElementVec;
    local_86f0 = &(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMaterialIds._M_t.
                  _M_impl.super__Rb_tree_header;
    lVar10 = 0;
    lVar9 = 0;
    do {
      nelem = (long)*(int *)(*(long *)&this->field_0xb0 + lVar10 * 4);
      if (-1 < nelem) {
        ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                            ((TPZChunkVector<TPZCompEl_*,_10> *)local_86e8,nelem);
        el = *ppTVar4;
        if (el != (TPZCompEl *)0x0) {
          plVar5 = (long *)(**(code **)(*(long *)el + 0xb8))(el);
          if ((plVar5 != (long *)0x0) &&
             (iVar2 = (**(code **)(*plVar5 + 0x58))(plVar5),
             (int)(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMaterialIds._M_t.
                  _M_impl.super__Rb_tree_header._M_node_count != 0)) {
            p_Var7 = local_86f0;
            for (p_Var1 = *(_Base_ptr *)
                           ((long)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.
                                   fMaterialIds._M_t._M_impl.super__Rb_tree_header._M_header + 8);
                (_Rb_tree_header *)p_Var1 != (_Rb_tree_header *)0x0;
                p_Var1 = (&p_Var1->_M_left)[(int)*(size_t *)(p_Var1 + 1) < iVar2]) {
              if (iVar2 <= (int)*(size_t *)(p_Var1 + 1)) {
                p_Var7 = (_Rb_tree_header *)p_Var1;
              }
            }
            p_Var8 = local_86f0;
            if ((p_Var7 != local_86f0) && (p_Var8 = p_Var7, iVar2 < (int)p_Var7->_M_node_count)) {
              p_Var8 = local_86f0;
            }
            if (p_Var8 == local_86f0) goto LAB_01387f85;
          }
          (**(code **)(*(long *)el + 0x108))(el,&local_4370,&local_86b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout," assemblando elemento frontal ",0x1e);
          poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          AssembleElement(this,el,&local_4370.super_TPZElementMatrix,
                          &local_86b0.super_TPZElementMatrix,local_86d8,local_86e0);
          if (this->f_quiet == 0) {
            local_86f4 = CONCAT31(local_86f4._1_3_,0x2a);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)&local_86f4,1);
            if ((lVar9 * -0x3333333333333333 + 0x1999999999999998U >> 2 |
                lVar9 * -0x3333333333333333 << 0x3e) < 0xccccccccccccccd) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
              poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar6,"% Elements assembled ",0x15);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
              std::ostream::put((char)poVar6);
              std::ostream::flush();
              std::ostream::flush();
            }
          }
          lVar9 = lVar9 + 1;
        }
      }
LAB_01387f85:
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar3);
  }
  local_86d0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_86d0.fStore != (int *)0x0) {
    operator_delete__(local_86d0.fStore);
  }
  local_86b0.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)&PTR__TPZElementMatrixT_0194d7b0;
  TPZBlock::~TPZBlock(&local_86b0.fConstrBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_86b0.fConstrMat.super_TPZFMatrix<double>,&PTR_PTR_01884558)
  ;
  TPZBlock::~TPZBlock(&local_86b0.fBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_86b0.fMat.super_TPZFMatrix<double>,&PTR_PTR_01884558);
  TPZElementMatrix::~TPZElementMatrix(&local_86b0.super_TPZElementMatrix);
  local_4370.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)&PTR__TPZElementMatrixT_0194d7b0;
  TPZBlock::~TPZBlock(&local_4370.fConstrBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_4370.fConstrMat.super_TPZFMatrix<double>,&PTR_PTR_01884558)
  ;
  TPZBlock::~TPZBlock(&local_4370.fBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_4370.fMat.super_TPZFMatrix<double>,&PTR_PTR_01884558);
  TPZElementMatrix::~TPZElementMatrix(&local_4370.super_TPZElementMatrix);
  return;
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::Assemble(TPZBaseMatrix & stiff_base, TPZBaseMatrix & rhs_base, TPZAutoPointer<TPZGuiInterface> guiInterface){
    if(!dynamic_cast<TPZMatrix<TVar>*>(&stiff_base) ||
       dynamic_cast<TPZFMatrix<TVar>*>(&rhs_base)){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" incompatible types. Aborting...\n";
        DebugStop();
    }
	auto& stiffness = dynamic_cast<TPZMatrix<TVar>&>(stiff_base);
    auto& rhs = dynamic_cast<TPZFMatrix<TVar>&>(rhs_base);
	int64_t iel;
	int64_t numel = 0, nelem = this->fMesh->NElements();
	TPZElementMatrixT<TVar> ek(this->fMesh,TPZElementMatrix::EK),ef(this->fMesh,TPZElementMatrix::EF);
	
	TPZAdmChunkVector<TPZCompEl *> &elementvec = this->fMesh->ElementVec();
	
	
	/**Rearange elements order*/
	TPZVec<int> elorder(this->fMesh->NEquations(),0);
	
	OrderElement();
	
	for(iel=0; iel < nelem; iel++) {
		
        int64_t elindex = fElementOrder[iel];
		if(elindex < 0) continue;
		TPZCompEl *el = elementvec[elindex];
		if(!el) continue;
		TPZMaterial * mat = el->Material();
		if(mat)
		{
			int matid = mat->Id();
			if(this->ShouldCompute(matid) == false)
			{
				continue;
			}
		}
		else
		{
		}
		
		//		int dim = el->NumNodes();
		
		//Builds elements stiffness matrix
		el->CalcStiff(ek,ef);
		
		
		std::cout<< " assemblando elemento frontal " << iel <<std::endl;
		
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			ek.fMat.Print("Element stiffness Frontal",sout);
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		
		AssembleElement(el, ek, ef, stiffness, rhs);
#ifdef PZ_LOG
		if(loggerel.isDebugEnabled())
		{
			std::stringstream sout;
			ek.fMat.Print("Element stiffness depois de assemblada ",sout);
			LOGPZ_DEBUG(loggerel,sout.str())
		}
#endif
		
		if(!f_quiet)
		{
			cout << '*';
			if(!(numel%20)) {
				cout << " " << (100*iel/nelem) << "% Elements assembled " << endl;
				cout.flush();
			}
		}
		numel++;
		
	}//fim for iel
	
}